

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkreplyimpl_p.cpp
# Opt level: O0

void QNetworkReplyImpl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 in_EDX;
  int in_ESI;
  QNetworkReplyImplPrivate *in_RDI;
  QNetworkReplyImpl *_t;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      d_func((QNetworkReplyImpl *)0x1ed29c);
      QNetworkReplyImplPrivate::_q_startOperation(in_RDI);
      break;
    case 1:
      d_func((QNetworkReplyImpl *)0x1ed2b0);
      QNetworkReplyImplPrivate::_q_copyReadyRead((QNetworkReplyImplPrivate *)_o);
      break;
    case 2:
      d_func((QNetworkReplyImpl *)0x1ed2c4);
      QNetworkReplyImplPrivate::_q_copyReadChannelFinished((QNetworkReplyImplPrivate *)0x1ed2cc);
      break;
    case 3:
      d_func((QNetworkReplyImpl *)0x1ed2d8);
      QNetworkReplyImplPrivate::_q_bufferOutgoingData(in_RDI);
      break;
    case 4:
      d_func((QNetworkReplyImpl *)0x1ed2ec);
      QNetworkReplyImplPrivate::_q_bufferOutgoingDataFinished(in_RDI);
    }
  }
  return;
}

Assistant:

void QNetworkReplyImpl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkReplyImpl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->d_func()->_q_startOperation(); break;
        case 1: _t->d_func()->_q_copyReadyRead(); break;
        case 2: _t->d_func()->_q_copyReadChannelFinished(); break;
        case 3: _t->d_func()->_q_bufferOutgoingData(); break;
        case 4: _t->d_func()->_q_bufferOutgoingDataFinished(); break;
        default: ;
        }
    }
    (void)_a;
}